

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O1

size_t dicroce::blob_tree::_sizeof_treeb(blob_tree *rt)

{
  _Base_ptr p_Var1;
  pointer pbVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  size_t sVar5;
  const_iterator __begin4;
  pointer rt_00;
  
  if ((rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    rt_00 = (rt->_childrenByIndex).
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_start;
    pbVar2 = (rt->_childrenByIndex).
             super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (rt_00 == pbVar2) {
      sVar5 = (rt->_payload).first + 9;
    }
    else {
      sVar5 = 5;
      do {
        sVar3 = _sizeof_treeb(rt_00);
        sVar5 = sVar5 + sVar3;
        rt_00 = rt_00 + 1;
      } while (rt_00 != pbVar2);
    }
  }
  else {
    sVar5 = 5;
    for (p_Var4 = (rt->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(rt->_children)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var1 = p_Var4[1]._M_parent;
      sVar3 = _sizeof_treeb((blob_tree *)(p_Var4 + 2));
      sVar5 = (long)&p_Var1->_M_color + sVar3 + sVar5 + 2;
    }
  }
  return sVar5;
}

Assistant:

static size_t _sizeof_treeb(const blob_tree& rt)
    {
        size_t sum = 1 + sizeof(uint32_t); // type & num children

        if(!rt._children.empty())
        {
            for(auto& cp : rt._children)
                sum += sizeof(uint16_t) + cp.first.length() + _sizeof_treeb(cp.second);
        }
        else if(!rt._childrenByIndex.empty())
        {
            for(auto& c : rt._childrenByIndex)
                sum += _sizeof_treeb(c);
        }
        else sum += sizeof(uint32_t) + rt._payload.first;

        return sum;
    }